

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O2

void do_macro(int *ip)

{
  ushort *puVar1;
  int iVar2;
  ushort **ppuVar3;
  char *pcVar4;
  
  if (pass == 1) {
    println();
  }
  else {
    if (expand_macro != 0) {
      pcVar4 = "Can not nest macro definitions!";
LAB_0010cff7:
      error(pcVar4);
      return;
    }
    if (lablptr == (t_symbol *)0x0) {
      ppuVar3 = __ctype_b_loc();
      puVar1 = *ppuVar3;
      iVar2 = *ip;
      pcVar4 = prlnbuf + iVar2;
      while (iVar2 = iVar2 + 1, (*(byte *)((long)puVar1 + (long)*pcVar4 * 2 + 1) & 0x20) != 0) {
        *ip = iVar2;
        pcVar4 = pcVar4 + 1;
      }
      iVar2 = colsym(ip);
      if (iVar2 == 0) {
        pcVar4 = "No name for this macro!";
        goto LAB_0010cff7;
      }
      lablptr = stlook(1);
      if (lablptr == (t_symbol *)0x0) {
        return;
      }
    }
    if (lablptr->refcnt != 0) {
      if (lablptr->type == 6) {
        pcVar4 = "Symbol already used by a function!";
      }
      else if (lablptr->type == 5) {
        pcVar4 = "Macro already defined!";
      }
      else {
        pcVar4 = "Symbol already used by a label!";
      }
      fatal_error(pcVar4);
      return;
    }
    iVar2 = check_eol(ip);
    if (iVar2 == 0) {
      return;
    }
    iVar2 = macro_install();
    if (iVar2 == 0) {
      return;
    }
  }
  in_macro = 1;
  return;
}

Assistant:

void
do_macro(int *ip)
{
	if (pass == LAST_PASS)
		println();
	else {
		/* error checking */
		if (expand_macro) {
			error("Can not nest macro definitions!");
			return;
		}
		if (lablptr == NULL) {
			/* skip spaces */
			while (isspace(prlnbuf[*ip]))
				(*ip)++;

			/* search a label after the .macro */
			if (colsym(ip) == 0) {
				error("No name for this macro!");
				return;
			}

			/* put the macro name in the symbol table */
			if ((lablptr = stlook(1)) == NULL)
				return;
		}
		if (lablptr->refcnt) {
			switch (lablptr->type) {
			case MACRO:
				fatal_error("Macro already defined!");
				return;

			case FUNC:
				fatal_error("Symbol already used by a function!");
				return;

			default:
				fatal_error("Symbol already used by a label!");
				return;
			}
		}
		if (!check_eol(ip))
			return;

		/* install this new macro in the hash table */
		if (!macro_install())
			return;
	}
	in_macro = 1;
}